

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O2

int amqp_set_rpc_timeout(amqp_connection_state_t state,timeval *timeout)

{
  __suseconds_t _Var1;
  
  if (timeout == (timeval *)0x0) {
    state->rpc_timeout = (timeval *)0x0;
  }
  else {
    if (timeout->tv_sec < 0) {
      return -10;
    }
    if (timeout->tv_usec < 0) {
      return -10;
    }
    state->rpc_timeout = &state->internal_rpc_timeout;
    _Var1 = timeout->tv_usec;
    (state->internal_rpc_timeout).tv_sec = timeout->tv_sec;
    (state->internal_rpc_timeout).tv_usec = _Var1;
  }
  return 0;
}

Assistant:

int amqp_set_rpc_timeout(amqp_connection_state_t state,
                         const struct timeval *timeout) {
  if (timeout) {
    if (timeout->tv_sec < 0 || timeout->tv_usec < 0) {
      return AMQP_STATUS_INVALID_PARAMETER;
    }
    state->rpc_timeout = &state->internal_rpc_timeout;
    *state->rpc_timeout = *timeout;
  } else {
    state->rpc_timeout = NULL;
  }
  return AMQP_STATUS_OK;
}